

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_nonfinite<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  
  uVar5 = (ulong)specs->width;
  if ((long)uVar5 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar3 = *(uint *)&fspecs->field_0x4;
  sVar4 = (out.container)->_M_string_length;
  uVar8 = uVar3 >> 8 & 0xff;
  uVar1 = (ulong)(uVar8 != 0) + 3;
  uVar10 = 0;
  if (uVar1 <= uVar5) {
    uVar10 = uVar5 - uVar1;
  }
  uVar5 = uVar10 >> ((ulong)*(byte *)((long)&basic_data<void>::left_padding_shifts +
                                     (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (out.container,sVar4 + 3 + (ulong)(uVar8 != 0) + (specs->fill).size_ * uVar10,'\0');
  pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar4,uVar5,&specs->fill);
  if (uVar8 != 0) {
    *pcVar6 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar8);
    pcVar6 = pcVar6 + 1;
  }
  pcVar7 = "INF";
  pcVar9 = "NAN";
  if ((uVar3 >> 0x10 & 1) == 0) {
    pcVar7 = "inf";
    pcVar9 = "nan";
  }
  if (isinf) {
    pcVar9 = pcVar7;
  }
  cVar2 = pcVar9[2];
  *(undefined2 *)pcVar6 = *(undefined2 *)pcVar9;
  pcVar6[2] = cVar2;
  fill<char*,char>(pcVar6 + 3,uVar10 - uVar5,&specs->fill);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}